

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_class_closure(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,ClassId class_id)

{
  int *piVar1;
  Alloc *pAVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  bool bVar4;
  Read<signed_char> RVar5;
  Read<signed_char> eq_marks;
  Alloc *local_48;
  void *pvStack_40;
  Read<signed_char> local_38;
  
  if (ent_dim <= class_dim) {
    RVar5 = mark_by_class((Omega_h *)&local_48,mesh,class_dim,class_dim,class_id);
    if (ent_dim == class_dim) {
      *(Alloc **)this = local_48;
      *(void **)(this + 8) = pvStack_40;
      bVar4 = ((ulong)local_48 & 7) != 0;
      pvVar3 = (void *)CONCAT71(RVar5.write_.shared_alloc_.direct_ptr._1_7_,
                                bVar4 || local_48 == (Alloc *)0x0);
      if ((!bVar4 && local_48 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        local_48->use_count = local_48->use_count + -1;
        *(size_t *)this = local_48->size * 8 + 1;
      }
      local_48 = (Alloc *)0x0;
      pvStack_40 = (void *)0x0;
    }
    else {
      local_38.write_.shared_alloc_.alloc = local_48;
      if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_38.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
        }
        else {
          local_48->use_count = local_48->use_count + 1;
        }
      }
      local_38.write_.shared_alloc_.direct_ptr = pvStack_40;
      RVar5 = mark_down(this,mesh,class_dim,ent_dim,&local_38);
      pAVar2 = local_38.write_.shared_alloc_.alloc;
      pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
      if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
          local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar3 = extraout_RDX;
        }
      }
    }
    pAVar2 = local_48;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      piVar1 = &local_48->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX_00;
      }
    }
    RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ent_dim <= class_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0x68);
}

Assistant:

Read<I8> mark_class_closure(
    Mesh* mesh, Int ent_dim, Int class_dim, ClassId class_id) {
  OMEGA_H_CHECK(ent_dim <= class_dim);
  auto eq_marks = mark_by_class(mesh, class_dim, class_dim, class_id);
  if (ent_dim == class_dim) return eq_marks;
  return mark_down(mesh, class_dim, ent_dim, eq_marks);
}